

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

BaseType Imath_3_2::(anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix44<float>>
                   (Matrix44<float> *A)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  Matrix44<float> *in_RDI;
  Matrix44<float> *pMVar4;
  uint j;
  uint i;
  T result;
  float local_18;
  uint local_14;
  uint local_10;
  float local_c;
  Matrix44<float> *local_8;
  
  local_c = 0.0;
  local_8 = in_RDI;
  for (local_10 = 0; uVar1 = local_10, uVar2 = Matrix44<float>::dimensions(), local_14 = local_10,
      uVar1 < uVar2; local_10 = local_10 + 1) {
    while( true ) {
      local_14 = local_14 + 1;
      uVar1 = local_14;
      uVar2 = Matrix44<float>::dimensions();
      if (uVar2 <= uVar1) break;
      pMVar4 = local_8;
      Matrix44<float>::operator[](local_8,local_10);
      std::abs((int)pMVar4);
      pfVar3 = std::max<float>(&local_c,&local_18);
      local_c = *pfVar3;
    }
  }
  return local_c;
}

Assistant:

IMATH_CONSTEXPR14 inline typename TM::BaseType
maxOffDiagSymm (const TM& A)
{
    typedef typename TM::BaseType T;
    T                             result = 0;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = i + 1; j < TM::dimensions (); ++j)
            result = std::max (result, std::abs (A[i][j]));

    return result;
}